

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::Utils::getShaderStageStringFromGLEnum_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,GLenum shader_stage_glenum)

{
  TestError *this_00;
  allocator<char> local_16;
  undefined1 local_15;
  int local_14;
  string *psStack_10;
  GLenum shader_stage_glenum_local;
  string *result;
  
  local_14 = (int)this;
  local_15 = 0;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_16)
  ;
  std::allocator<char>::~allocator(&local_16);
  if (local_14 == 0x8b30) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Fragment Shader");
  }
  else if (local_14 == 0x8b31) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Vertex Shader");
  }
  else if (local_14 == 0x8dd9) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Geometry Shader");
  }
  else if (local_14 == 0x8e87) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Tessellation Evaluation Shader");
  }
  else {
    if (local_14 != 0x8e88) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader string",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x50f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Tessellation Control Shader");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getShaderStageStringFromGLEnum(const glw::GLenum shader_stage_glenum)
{
	std::string result = "?";

	switch (shader_stage_glenum)
	{
	case GL_FRAGMENT_SHADER:
		result = "Fragment Shader";
		break;
	case GL_GEOMETRY_SHADER:
		result = "Geometry Shader";
		break;
	case GL_TESS_CONTROL_SHADER:
		result = "Tessellation Control Shader";
		break;
	case GL_TESS_EVALUATION_SHADER:
		result = "Tessellation Evaluation Shader";
		break;
	case GL_VERTEX_SHADER:
		result = "Vertex Shader";
		break;

	default:
	{
		TCU_FAIL("Unrecognized shader string");
	}
	} /* switch (shader_stage_glenum) */

	return result;
}